

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.h
# Opt level: O2

bool __thiscall jbcoin::STAccount::isEquivalent(STAccount *this,STBase *t)

{
  bool bVar1;
  
  if ((t->_vptr_STBase == (_func_int **)&PTR__STBase_002f7f40) &&
     (this->default_ == (bool)*(char *)((long)&t[2]._vptr_STBase + 4))) {
    bVar1 = jbcoin::operator==(&this->value_,(base_uint<160UL,_void> *)(t + 1));
    return bVar1;
  }
  return false;
}

Assistant:

bool
    isEquivalent (const STBase& t) const override
    {
        auto const* const tPtr = dynamic_cast<STAccount const*>(&t);
        return tPtr && (default_ == tPtr->default_) && (value_ == tPtr->value_);
    }